

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
cnn::Tensor::operator*
          (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>
           *__return_storage_ptr__,Tensor *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((this->d).bd != 1) {
    __assert_fail("d.batch_elems() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                  ,0x28,"Eigen::Map<Eigen::MatrixXf> cnn::Tensor::operator*()");
  }
  uVar1 = (this->d).nd;
  if (uVar1 < 3) {
    uVar2 = (this->d).d[0];
    uVar3 = 1;
    if (uVar1 == 2) {
      uVar3 = (ulong)(this->d).d[1];
    }
    (__return_storage_ptr__->
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>).
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = this->v;
    (__return_storage_ptr__->
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>).
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (ulong)uVar2;
    (__return_storage_ptr__->
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>).
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = uVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("d.ndims() < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                ,0x29,"Eigen::Map<Eigen::MatrixXf> cnn::Tensor::operator*()");
}

Assistant:

Eigen::Map<Eigen::MatrixXf> operator*() {
    assert(d.batch_elems() == 1);
    assert(d.ndims() < 3);
    return Eigen::Map<Eigen::MatrixXf>(v, d.rows(), d.cols());
  }